

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableViewPrivate::selectRow(QTableViewPrivate *this,int row,bool anchor)

{
  QAbstractItemModel *pQVar1;
  QRect QVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  SelectionBehavior SVar6;
  SelectionMode SVar7;
  int iVar8;
  int iVar9;
  QFlags<QItemSelectionModel::SelectionFlag> QVar10;
  QTableView *pQVar11;
  QItemSelectionModel *pQVar12;
  int *piVar13;
  SelectionFlag SVar14;
  byte in_DL;
  int in_ESI;
  QTableViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int column;
  QTableView *q;
  QModelIndex lower;
  QModelIndex upper;
  int rowSectionAnchor;
  QPersistentModelIndex startIndex;
  SelectionFlags command;
  QModelIndex index;
  undefined4 in_stack_fffffffffffffdd8;
  SelectionFlag in_stack_fffffffffffffddc;
  QListSpecialMethodsBase<QModelIndex> *in_stack_fffffffffffffde0;
  QHeaderView *in_stack_fffffffffffffde8;
  QTableView *pQVar15;
  QItemSelection local_168;
  undefined1 local_150 [16];
  QRect local_140;
  undefined1 local_130 [16];
  QPersistentModelIndex local_120 [3];
  QModelIndex local_108;
  QPersistentModelIndex local_f0 [3];
  QModelIndex local_d8;
  int local_bc;
  undefined1 local_b8 [24];
  QPersistentModelIndex local_a0 [3];
  undefined1 local_88 [24];
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_70;
  undefined4 local_6c;
  QPersistentModelIndex local_68;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> local_5c;
  QPersistentModelIndex local_58 [3];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QPersistentModelIndex local_28 [3];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_DL & 1;
  local_c = in_ESI;
  pQVar11 = q_func(in_RDI);
  SVar6 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_fffffffffffffde0);
  QVar2.x2.m_i = local_140.x2.m_i;
  QVar2.y2.m_i = local_140.y2.m_i;
  QVar2.x1.m_i = local_140.x1.m_i;
  QVar2.y1.m_i = local_140.y1.m_i;
  if (SVar6 == SelectColumns) goto LAB_008c086e;
  SVar7 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_fffffffffffffde0);
  if (SVar7 == SingleSelection) {
    SVar6 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_fffffffffffffde0);
    QVar2.x2.m_i = local_140.x2.m_i;
    QVar2.y2.m_i = local_140.y2.m_i;
    QVar2.x1.m_i = local_140.x1.m_i;
    QVar2.y1.m_i = local_140.y1.m_i;
    if (SVar6 == SelectItems) goto LAB_008c086e;
  }
  iVar9 = local_c;
  bVar4 = false;
  if (-1 < local_c) {
    pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_28);
    iVar8 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_28);
    bVar4 = iVar9 < iVar8;
  }
  QVar2.x2.m_i = local_140.x2.m_i;
  QVar2.y2.m_i = local_140.y2.m_i;
  QVar2.x1.m_i = local_140.x1.m_i;
  QVar2.y1.m_i = local_140.y1.m_i;
  if (!bVar4) goto LAB_008c086e;
  bVar4 = QWidget::isRightToLeft((QWidget *)0x8c0226);
  if (bVar4) {
    QWidget::width((QWidget *)0x8c0240);
  }
  iVar8 = QHeaderView::logicalIndexAt
                    (in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
  iVar9 = local_c;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_58);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_40,pQVar1,iVar9,iVar8,local_58);
  local_5c.i = 0xaaaaaaaa;
  local_5c.i = (**(code **)(*(long *)&(pQVar11->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget + 0x2e8))(pQVar11,&local_40,0);
  local_68.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex
            (&local_68,&(in_RDI->super_QAbstractItemViewPrivate).currentSelectionStartIndex);
  pQVar12 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8c0361);
  QFlags<QItemSelectionModel::SelectionFlag>::QFlags
            ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffddc);
  (**(code **)(*(long *)pQVar12 + 0x60))(pQVar12,&local_40,local_6c);
  QPersistentModelIndex::operator=
            (&(in_RDI->super_QAbstractItemViewPrivate).currentSelectionStartIndex,&local_68);
  QPersistentModelIndex::~QPersistentModelIndex(&local_68);
  if (bVar3 == 0) {
LAB_008c03f5:
    SVar7 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_fffffffffffffde0);
    bVar4 = SVar7 == SingleSelection;
  }
  else {
    local_70.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffde0,
                    in_stack_fffffffffffffddc);
    bVar5 = QFlags<QItemSelectionModel::SelectionFlag>::operator!
                      ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_70);
    bVar4 = true;
    if (!bVar5) goto LAB_008c03f5;
  }
  if (bVar4) {
    pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_a0);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_88,pQVar1,local_c,iVar8,local_a0);
    QPersistentModelIndex::operator=
              (&(in_RDI->super_QAbstractItemViewPrivate).currentSelectionStartIndex,
               (QModelIndex *)local_88);
  }
  SVar7 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_fffffffffffffde0);
  if ((SVar7 != SingleSelection) &&
     (bVar4 = QFlags<QItemSelectionModel::SelectionFlag>::testFlag
                        ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffddc), bVar4)) {
    if (bVar3 != 0) {
      QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffde0);
      QItemSelectionModel::selectedRows((int)local_b8);
      bVar4 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                        (in_stack_fffffffffffffde0,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      SVar14 = Select;
      if (bVar4) {
        SVar14 = Deselect;
      }
      (in_RDI->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag = SVar14;
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8c053d);
    }
    QFlags<QItemSelectionModel::SelectionFlag>::operator&=
              ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_5c,-9);
    QFlags<QItemSelectionModel::SelectionFlag>::operator|=
              ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_5c,
               (in_RDI->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag);
    if (bVar3 == 0) {
      QFlags<QItemSelectionModel::SelectionFlag>::operator|=
                ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_5c,Current);
    }
  }
  local_bc = QPersistentModelIndex::row();
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
  piVar13 = qMin<int>(&local_bc,&local_c);
  iVar9 = *piVar13;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_f0);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_d8,pQVar1,iVar9,iVar8,local_f0);
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_108.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
  piVar13 = qMax<int>(&local_bc,&local_c);
  iVar9 = *piVar13;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_120);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_108,pQVar1,iVar9,iVar8,local_120);
  bVar4 = QHeaderView::sectionsMoved((QHeaderView *)in_stack_fffffffffffffde0);
  if (bVar4) {
    iVar9 = QModelIndex::row(&local_d8);
    iVar8 = QModelIndex::row(&local_108);
    if (iVar9 != iVar8) {
      pQVar15 = pQVar11;
      local_140 = (QRect)(**(code **)(*(long *)&(pQVar11->super_QAbstractItemView).
                                                super_QAbstractScrollArea.super_QFrame.super_QWidget
                                     + 0x1e0))(pQVar11,&local_d8);
      local_150 = (**(code **)(*(long *)&(pQVar11->super_QAbstractItemView).
                                         super_QAbstractScrollArea.super_QFrame.super_QWidget +
                              0x1e0))(pQVar11,&local_108);
      local_130 = QRect::operator|(&local_140,(QRect *)local_150);
      QVar10 = QFlags<QItemSelectionModel::SelectionFlag>::operator|
                         ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffddc);
      (**(code **)(*(long *)&(pQVar15->super_QAbstractItemView).super_QAbstractScrollArea.
                             super_QFrame.super_QWidget + 0x2c8))
                (pQVar15,local_130,
                 QVar10.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      QVar2 = local_140;
      goto LAB_008c086e;
    }
  }
  pQVar12 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8c080a);
  QItemSelection::QItemSelection(&local_168,(QModelIndex *)&local_d8,(QModelIndex *)&local_108);
  QVar10 = QFlags<QItemSelectionModel::SelectionFlag>::operator|
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)pQVar12,
                      in_stack_fffffffffffffddc);
  (**(code **)(*(long *)pQVar12 + 0x70))
            (pQVar12,&local_168,
             QVar10.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  QItemSelection::~QItemSelection((QItemSelection *)0x8c086c);
  QVar2.x2.m_i = local_140.x2.m_i;
  QVar2.y2.m_i = local_140.y2.m_i;
  QVar2.x1.m_i = local_140.x1.m_i;
  QVar2.y1.m_i = local_140.y1.m_i;
LAB_008c086e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    local_140 = QVar2;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::selectRow(int row, bool anchor)
{
    Q_Q(QTableView);

    if (q->selectionBehavior() == QTableView::SelectColumns
        || (q->selectionMode() == QTableView::SingleSelection
            && q->selectionBehavior() == QTableView::SelectItems))
        return;

    if (row >= 0 && row < model->rowCount(root)) {
        int column = horizontalHeader->logicalIndexAt(q->isRightToLeft() ? viewport->width() : 0);
        QModelIndex index = model->index(row, column, root);
        QItemSelectionModel::SelectionFlags command = q->selectionCommand(index);

        {
            // currentSelectionStartIndex gets modified inside QAbstractItemView::currentChanged()
            const auto startIndex = currentSelectionStartIndex;
            selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
            currentSelectionStartIndex = startIndex;
        }

        if ((anchor && !(command & QItemSelectionModel::Current))
            || (q->selectionMode() == QTableView::SingleSelection))
            currentSelectionStartIndex = model->index(row, column, root);

        if (q->selectionMode() != QTableView::SingleSelection
            && command.testFlag(QItemSelectionModel::Toggle)) {
            if (anchor)
                ctrlDragSelectionFlag = verticalHeader->selectionModel()->selectedRows(column).contains(index)
                                    ? QItemSelectionModel::Deselect : QItemSelectionModel::Select;
            command &= ~QItemSelectionModel::Toggle;
            command |= ctrlDragSelectionFlag;
            if (!anchor)
                command |= QItemSelectionModel::Current;
        }

        const auto rowSectionAnchor = currentSelectionStartIndex.row();
        QModelIndex upper = model->index(qMin(rowSectionAnchor, row), column, root);
        QModelIndex lower = model->index(qMax(rowSectionAnchor, row), column, root);
        if ((verticalHeader->sectionsMoved() && upper.row() != lower.row())) {
            q->setSelection(q->visualRect(upper) | q->visualRect(lower), command | QItemSelectionModel::Rows);
        } else {
            selectionModel->select(QItemSelection(upper, lower), command | QItemSelectionModel::Rows);
        }
    }
}